

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

_Bool duckdb_je_background_threads_enable(tsd_t *tsd)

{
  tsd_t *tsd_00;
  void *pvVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  pthread_mutex_t *__mutex;
  background_thread_info_t *info;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint i;
  undefined8 uStack_50;
  ulong local_48;
  uint local_3c;
  undefined1 *local_38;
  
  lVar2 = -(duckdb_je_max_background_threads + 0xf & 0xfffffffffffffff0);
  puVar7 = (undefined1 *)((long)&local_48 + lVar2);
  local_38 = puVar7;
  if (duckdb_je_max_background_threads != 0) {
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d551a1;
    switchD_012e3010::default(puVar7,0,duckdb_je_max_background_threads);
  }
  *local_38 = 1;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d551ad;
  local_3c = duckdb_je_narenas_total_get();
  uVar6 = (ulong)local_3c;
  if (1 < local_3c) {
    uVar9 = 0;
    uVar8 = 1;
    sVar5 = duckdb_je_max_background_threads;
    puVar7 = local_38;
    local_48 = uVar6;
    do {
      if ((puVar7[uVar8 % sVar5] == '\0') &&
         (sVar5 = duckdb_je_max_background_threads, duckdb_je_arenas[uVar8].repr != (void *)0x0)) {
        tsd_00 = (tsd_t *)(duckdb_je_background_thread_info +
                          uVar8 % duckdb_je_max_background_threads);
        __mutex = (pthread_mutex_t *)
                  ((long)&duckdb_je_background_thread_info[uVar8 % duckdb_je_max_background_threads]
                          .mtx.field_0 + 0x48);
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d55228;
        info = duckdb_je_background_thread_info;
        iVar4 = pthread_mutex_trylock(__mutex);
        if (iVar4 != 0) {
          *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d55235;
          duckdb_je_malloc_mutex_lock_slow
                    ((malloc_mutex_t *)
                     &tsd_00->
                      cant_access_tsd_items_directly_use_a_getter_or_setter_prof_sample_event_wait);
          *(undefined1 *)
           &tsd_00->
            cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small = 1;
        }
        tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state =
             tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state + 1;
        if ((tsd_t *)tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata != tsd
           ) {
          tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata =
               (prof_tdata_t *)tsd;
          tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_dalloc_event_wait =
               tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_dalloc_event_wait
               + 1;
        }
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d55254;
        background_thread_init(tsd_00,info);
        *(undefined1 *)
         &tsd_00->
          cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small = 0;
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d55261;
        pthread_mutex_unlock(__mutex);
        sVar5 = duckdb_je_max_background_threads;
        local_38[uVar8 % duckdb_je_max_background_threads] = 1;
        uVar9 = (ulong)((int)uVar9 + 1);
        uVar6 = local_48;
        puVar7 = local_38;
        if (sVar5 == uVar9) break;
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d5529d;
  _Var3 = background_thread_create_locked(tsd,0);
  if (local_3c != 0 && !_Var3) {
    uVar8 = 0;
    do {
      pvVar1 = duckdb_je_arenas[uVar8].repr;
      if (pvVar1 != (void *)0x0) {
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1d552d3;
        duckdb_je_pa_shard_set_deferral_allowed
                  ((tsdn_t *)tsd,(pa_shard_t *)((long)pvVar1 + 0x29a8),true);
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  return _Var3;
}

Assistant:

bool
background_threads_enable(tsd_t *tsd) {
	assert(n_background_threads == 0);
	assert(background_thread_enabled());
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	VARIABLE_ARRAY(bool, marked, max_background_threads);
	unsigned nmarked;
	for (size_t i = 0; i < max_background_threads; i++) {
		marked[i] = false;
	}
	nmarked = 0;
	/* Thread 0 is required and created at the end. */
	marked[0] = true;
	/* Mark the threads we need to create for thread 0. */
	unsigned narenas = narenas_total_get();
	for (unsigned i = 1; i < narenas; i++) {
		if (marked[i % max_background_threads] ||
		    arena_get(tsd_tsdn(tsd), i, false) == NULL) {
			continue;
		}
		background_thread_info_t *info = &background_thread_info[
		    i % max_background_threads];
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		assert(info->state == background_thread_stopped);
		background_thread_init(tsd, info);
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		marked[i % max_background_threads] = true;
		if (++nmarked == max_background_threads) {
			break;
		}
	}

	bool err = background_thread_create_locked(tsd, 0);
	if (err) {
		return true;
	}
	for (unsigned i = 0; i < narenas; i++) {
		arena_t *arena = arena_get(tsd_tsdn(tsd), i, false);
		if (arena != NULL) {
			pa_shard_set_deferral_allowed(tsd_tsdn(tsd),
			    &arena->pa_shard, true);
		}
	}
	return false;
}